

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O0

void aom_highbd_filter_block1d16_h4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  int16_t *in_stack_000000e8;
  uint32_t in_stack_000000f4;
  ptrdiff_t in_stack_000000f8;
  uint16_t *in_stack_00000100;
  ptrdiff_t in_stack_00000108;
  uint16_t *in_stack_00000110;
  int in_stack_00000480;
  
  aom_highbd_filter_block1d8_h4_sse2
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
             in_stack_000000f4,in_stack_000000e8,in_stack_00000480);
  aom_highbd_filter_block1d8_h4_sse2
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
             in_stack_000000f4,in_stack_000000e8,in_stack_00000480);
  return;
}

Assistant:

static void aom_highbd_filter_block1d16_h4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  aom_highbd_filter_block1d8_h4_sse2(src_ptr, src_pitch, dst_ptr, dst_pitch,
                                     height, filter, bd);
  aom_highbd_filter_block1d8_h4_sse2((src_ptr + 8), src_pitch, (dst_ptr + 8),
                                     dst_pitch, height, filter, bd);
}